

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

char * absl::lts_20250127::StackString(void **pcs,int n,char *buf,int maxlen,bool symbolize)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  char sym [200];
  char local_f8 [200];
  
  uVar6 = 0;
  for (iVar5 = 0; ((uint)n != uVar6 && (iVar2 = maxlen - iVar5, iVar2 != 0 && iVar5 <= maxlen));
      iVar5 = iVar5 + (int)sVar3) {
    if (symbolize) {
      bVar1 = Symbolize(pcs[uVar6],local_f8,200);
      if (!bVar1) {
        local_f8[0] = '\0';
      }
      pcVar4 = "";
      if (uVar6 == 0) {
        pcVar4 = "\n";
      }
      snprintf(buf + iVar5,(long)iVar2,"%s\t@ %p %s\n",pcVar4,pcs[uVar6],local_f8);
    }
    else {
      snprintf(buf + iVar5,(long)iVar2," %p",pcs[uVar6]);
    }
    sVar3 = strlen(buf + iVar5);
    uVar6 = uVar6 + 1;
  }
  return buf;
}

Assistant:

static char* StackString(void** pcs, int n, char* buf, int maxlen,
                         bool symbolize) {
  static constexpr int kSymLen = 200;
  char sym[kSymLen];
  int len = 0;
  for (int i = 0; i != n; i++) {
    if (len >= maxlen)
      return buf;
    size_t count = static_cast<size_t>(maxlen - len);
    if (symbolize) {
      if (!absl::Symbolize(pcs[i], sym, kSymLen)) {
        sym[0] = '\0';
      }
      snprintf(buf + len, count, "%s\t@ %p %s\n", (i == 0 ? "\n" : ""), pcs[i],
               sym);
    } else {
      snprintf(buf + len, count, " %p", pcs[i]);
    }
    len += strlen(&buf[len]);
  }
  return buf;
}